

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddString(RepeatedPtrFieldBase *this)

{
  int iVar1;
  Arena *pAVar2;
  bool bVar3;
  void **ppvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  Rep *pRVar6;
  int __old_val;
  anon_class_8_1_a7a63227 local_30;
  anon_class_8_1_a7a63227 local_28;
  
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           this->tagged_rep_or_elem_;
  pAVar2 = this->arena_;
  local_30.arena = pAVar2;
  local_28.arena = pAVar2;
  if (pbVar5 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this->current_size_ = 1;
    pbVar5 = absl::lts_20240722::utility_internal::
             IfConstexprElse<false,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_2_>
                       (&local_28,&local_30);
    this->tagged_rep_or_elem_ = pbVar5;
  }
  else if (((ulong)pbVar5 & 1) == 0) {
    if (this->current_size_ == 0) {
      this->current_size_ = 1;
    }
    else {
      ppvVar4 = InternalExtend(this,1);
      pbVar5 = absl::lts_20240722::utility_internal::
               IfConstexprElse<false,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_2_>
                         (&local_28,&local_30);
      *ppvVar4 = pbVar5;
      pRVar6 = rep(this);
      pRVar6->allocated_size = 2;
      this->current_size_ = 2;
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppvVar4;
    }
  }
  else {
    pRVar6 = rep(this);
    bVar3 = SizeAtCapacity(this);
    if (bVar3) {
      InternalExtend(this,1);
      pRVar6 = rep(this);
    }
    else {
      iVar1 = this->current_size_;
      if (iVar1 != pRVar6->allocated_size) {
        this->current_size_ = iVar1 + 1;
        return pRVar6->elements[iVar1];
      }
    }
    pRVar6->allocated_size = pRVar6->allocated_size + 1;
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    pbVar5 = absl::lts_20240722::utility_internal::
             IfConstexprElse<false,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_2_>
                       (&local_28,&local_30);
    pRVar6->elements[iVar1] = pbVar5;
  }
  return pbVar5;
}

Assistant:

void* RepeatedPtrFieldBase::AddString() {
  return AddInternal([](Arena* arena) { return NewStringElement(arena); });
}